

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O1

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,char (*value) [2])

{
  uint *puVar1;
  size_t sVar2;
  ostringstream oss;
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190 + -0x18));
  *puVar1 = *puVar1 | 0x104;
  sVar2 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,*value,sVar2);
  std::__cxx11::stringbuf::str();
  if (this->messageTarget_ != (Failure *)0x0) {
    std::__cxx11::string::_M_append((char *)&this->messageTarget_->message_,(ulong)local_1b0);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return this;
}

Assistant:

TestResult& operator<<(const T& value) {
    std::ostringstream oss;
    oss.precision(16);
    oss.setf(std::ios_base::floatfield);
    oss << value;
    return addToLastFailure(oss.str());
  }